

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O1

NameEquality
google::protobuf::compiler::java::anon_unknown_0::CheckNameEquality(string *a,string *b)

{
  size_t __n;
  int iVar1;
  NameEquality NVar2;
  pointer pcVar3;
  bool bVar4;
  size_type *local_70;
  string out;
  string out_1;
  
  pcVar3 = (a->_M_dataplus)._M_p;
  local_70 = &out._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar3,pcVar3 + a->_M_string_length)
  ;
  if (out._M_dataplus._M_p != (pointer)0x0) {
    pcVar3 = (pointer)0x0;
    do {
      if ((byte)(*(char *)((long)local_70 + (long)pcVar3) + 0x9fU) < 0x1a) {
        *(char *)((long)local_70 + (long)pcVar3) = *(char *)((long)local_70 + (long)pcVar3) + -0x20;
      }
      pcVar3 = pcVar3 + 1;
    } while (out._M_dataplus._M_p != pcVar3);
  }
  pcVar3 = (b->_M_dataplus)._M_p;
  out.field_2._8_8_ = &out_1._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&out.field_2 + 8),pcVar3,pcVar3 + b->_M_string_length);
  if (out_1._M_dataplus._M_p != (pointer)0x0) {
    pcVar3 = (pointer)0x0;
    do {
      if ((byte)(pcVar3[out.field_2._8_8_] + 0x9fU) < 0x1a) {
        pcVar3[out.field_2._8_8_] = pcVar3[out.field_2._8_8_] + -0x20;
      }
      pcVar3 = pcVar3 + 1;
    } while (out_1._M_dataplus._M_p != pcVar3);
  }
  if (out._M_dataplus._M_p == out_1._M_dataplus._M_p) {
    if (out._M_dataplus._M_p == (pointer)0x0) {
      bVar4 = true;
    }
    else {
      iVar1 = bcmp(local_70,(void *)out.field_2._8_8_,(size_t)out._M_dataplus._M_p);
      bVar4 = iVar1 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if ((size_type *)out.field_2._8_8_ != &out_1._M_string_length) {
    operator_delete((void *)out.field_2._8_8_);
  }
  if (local_70 != &out._M_string_length) {
    operator_delete(local_70);
  }
  NVar2 = NO_MATCH;
  if (bVar4) {
    __n = a->_M_string_length;
    NVar2 = EQUAL_IGNORE_CASE;
    if (__n == b->_M_string_length) {
      if (__n == 0) {
        NVar2 = EXACT_EQUAL;
      }
      else {
        iVar1 = bcmp((a->_M_dataplus)._M_p,(b->_M_dataplus)._M_p,__n);
        NVar2 = EQUAL_IGNORE_CASE - (iVar1 == 0);
      }
    }
  }
  return NVar2;
}

Assistant:

NameEquality CheckNameEquality(const string& a, const string& b) {
  if (ToUpper(a) == ToUpper(b)) {
    if (a == b) {
      return NameEquality::EXACT_EQUAL;
    }
    return NameEquality::EQUAL_IGNORE_CASE;
  }
  return NameEquality::NO_MATCH;
}